

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

State * __thiscall re2::DFA::StateSaver::Restore(StateSaver *this)

{
  State *pSVar1;
  Mutex *this_00;
  LogMessage local_190;
  
  if (this->is_special_ == true) {
    pSVar1 = this->special_;
  }
  else {
    this_00 = &this->dfa_->mutex_;
    Mutex::Lock(this_00);
    pSVar1 = CachedState(this->dfa_,this->inst_,this->ninst_,this->flag_);
    if (pSVar1 == (State *)0x0) {
      LogMessage::LogMessage
                (&local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
                 ,0x4e5);
      std::operator<<((ostream *)&local_190.str_,"StateSaver failed to restore state.");
      LogMessage::~LogMessage(&local_190);
    }
    Mutex::Unlock(this_00);
  }
  return pSVar1;
}

Assistant:

DFA::State* DFA::StateSaver::Restore() {
  if (is_special_)
    return special_;
  MutexLock l(&dfa_->mutex_);
  State* s = dfa_->CachedState(inst_, ninst_, flag_);
  if (s == NULL)
    LOG(DFATAL) << "StateSaver failed to restore state.";
  return s;
}